

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefCast(TranslateToFuzzReader *this,Type type)

{
  uint32_t uVar1;
  BasicHeapType BVar2;
  BasicHeapType BVar3;
  Expression *ref;
  RefCast *pRVar4;
  HeapType local_38;
  HeapType local_30;
  Type local_28;
  Type type_local;
  Type refType;
  
  local_28.id = type.id;
  if ((type.id < 7) || ((type.id & 1) != 0)) {
    __assert_fail("type.isRef()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x12c8,"Expression *wasm::TranslateToFuzzReader::makeRefCast(Type)");
  }
  if ((~*(uint *)(this->wasm + 0x178) & 0x500) != 0) {
    __assert_fail("wasm.features.hasReferenceTypes() && wasm.features.hasGC()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x12c9,"Expression *wasm::TranslateToFuzzReader::makeRefCast(Type)");
  }
  type_local.id = 0;
  uVar1 = Random::upTo(&this->random,3);
  if (uVar1 == 2) {
    type_local = getSubType(this,type);
  }
  else {
    if (uVar1 != 1) {
      if (uVar1 != 0) {
        wasm::handle_unreachable
                  ("bad case",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0x12e4);
      }
      type_local = getReferenceType(this);
      local_38 = Type::getHeapType(&type_local);
      BVar2 = HeapType::getBottom(&local_38);
      local_30 = Type::getHeapType(&local_28);
      BVar3 = HeapType::getBottom(&local_30);
      type.id = local_28.id;
      if (BVar2 == BVar3) goto LAB_00143205;
    }
    type_local = getSuperType(this,type);
  }
LAB_00143205:
  ref = make(this,type_local);
  pRVar4 = Builder::makeRefCast(&this->builder,ref,local_28);
  return (Expression *)pRVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeRefCast(Type type) {
  assert(type.isRef());
  assert(wasm.features.hasReferenceTypes() && wasm.features.hasGC());
  // As with RefTest, use possibly related types. Unlike there, we are given the
  // output type, which is the cast type, so just generate the ref's type.
  Type refType;
  switch (upTo(3)) {
    case 0:
      // Totally random.
      refType = getReferenceType();
      // They must share a bottom type in order to validate.
      if (refType.getHeapType().getBottom() == type.getHeapType().getBottom()) {
        break;
      }
      // Otherwise, fall through and generate things in a way that is
      // guaranteed to validate.
      [[fallthrough]];
    case 1: {
      // Cast is a subtype of ref. We can't modify |type|, so find a supertype
      // for the ref.
      refType = getSuperType(type);
      break;
    }
    case 2:
      // Ref is a subtype of cast.
      refType = getSubType(type);
      break;
    default:
      // This unreachable avoids a warning on refType being possibly undefined.
      WASM_UNREACHABLE("bad case");
  }
  return builder.makeRefCast(make(refType), type);
}